

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

void __thiscall
hungarian_algorithm::
BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
::~BruteForceSolver(BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
                    *this)

{
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->covered_cols_).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->optimal_assignment_).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->current_assignment_).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

BruteForceSolver(const CostFunction& cost_function, const Size num_rows, const Size num_cols,
                   const CostComparator& cost_comparator, const Cost& zero_cost)
    : cost_function_(cost_function), cost_comparator_(cost_comparator), zero_cost_(zero_cost),
      num_rows_(static_cast<std::size_t>(num_rows)), num_cols_(static_cast<std::size_t>(num_cols)),
      current_assignment_(num_rows_, num_cols_), optimal_assignment_(num_rows_, num_cols_),
      covered_cols_(num_cols_, false), optimal_cost_(num_rows_, zero_cost)
  {
  }